

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theory.cpp
# Opt level: O0

OperatorType * Kernel::Theory::getConversionOperationType(Interpretation i)

{
  OperatorType *pOVar1;
  int in_EDI;
  TermList to;
  TermList from;
  TermList local_18;
  TermList local_10;
  int local_4;
  
  local_4 = in_EDI;
  TermList::TermList(&local_10);
  TermList::TermList(&local_18);
  pOVar1 = (OperatorType *)
           (*(code *)(&DAT_00efb304 + *(int *)(&DAT_00efb304 + (ulong)(local_4 - 0x46) * 4)))();
  return pOVar1;
}

Assistant:

OperatorType* Theory::getConversionOperationType(Interpretation i)
{
  TermList from, to;
  switch(i) {
  case INT_TO_RAT:
    from = AtomicSort::intSort();
    to = AtomicSort::rationalSort();
    break;
  case INT_TO_REAL:
    from = AtomicSort::intSort();
    to = AtomicSort::realSort();
    break;
  case RAT_TO_INT:
    from = AtomicSort::rationalSort();
    to = AtomicSort::intSort();
    break;
  case RAT_TO_REAL:
    from = AtomicSort::rationalSort();
    to = AtomicSort::realSort();
    break;
  case REAL_TO_INT:
    from = AtomicSort::realSort();
    to = AtomicSort::intSort();
    break;
  case REAL_TO_RAT:
    from = AtomicSort::realSort();
    to = AtomicSort::rationalSort();
    break;
  default:
    ASSERTION_VIOLATION;
  }
  return OperatorType::getFunctionType({from}, to);
}